

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O0

void SetInitialProfiles(N_Vector u,sunrealtype dx,sunrealtype dy)

{
  long lVar1;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  sunrealtype *udata;
  sunrealtype cy;
  sunrealtype cx;
  sunrealtype y;
  sunrealtype x;
  int jy;
  int jx;
  undefined4 local_20;
  undefined4 local_1c;
  
  lVar1 = N_VGetArrayPointer(in_RDI);
  for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
    dVar2 = (double)local_20 * in_XMM1_Qa + 30.0;
    dVar2 = (dVar2 - 40.0) * 0.1 * (dVar2 - 40.0) * 0.1;
    dVar2 = dVar2 * dVar2 * 0.5 + (1.0 - dVar2);
    for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
      dVar3 = (double)local_1c * in_XMM0_Qa + 0.0;
      dVar3 = (dVar3 - 10.0) * 0.1 * (dVar3 - 10.0) * 0.1;
      dVar3 = dVar3 * dVar3 * 0.5 + (1.0 - dVar3);
      *(double *)(lVar1 + (long)(local_1c * 2 + local_20 * 0x14) * 8) = dVar3 * 1000000.0 * dVar2;
      *(double *)(lVar1 + (long)(local_1c * 2 + 1 + local_20 * 0x14) * 8) =
           dVar3 * 1000000000000.0 * dVar2;
    }
  }
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector u, sunrealtype dx, sunrealtype dy)
{
  int jx, jy;
  sunrealtype x, y, cx, cy;
  sunrealtype* udata;

  /* Set pointer to data array in vector u. */

  udata = N_VGetArrayPointer(u);

  /* Load initial profiles of c1 and c2 into u vector */

  for (jy = 0; jy < MY; jy++)
  {
    y  = YMIN + jy * dy;
    cy = SQR(SUN_RCONST(0.1) * (y - YMID));
    cy = ONE - cy + SUN_RCONST(0.5) * SQR(cy);
    for (jx = 0; jx < MX; jx++)
    {
      x                       = XMIN + jx * dx;
      cx                      = SQR(SUN_RCONST(0.1) * (x - XMID));
      cx                      = ONE - cx + SUN_RCONST(0.5) * SQR(cx);
      IJKth(udata, 1, jx, jy) = C1_SCALE * cx * cy;
      IJKth(udata, 2, jx, jy) = C2_SCALE * cx * cy;
    }
  }
}